

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

FileEntryInfo * __thiscall
IsoWriter::getEntryByName(IsoWriter *this,string *name,FileTypes fileType)

{
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  const_reference name_00;
  undefined4 extraout_var;
  reference pbVar4;
  ulong uVar5;
  FileEntryInfo *local_c0;
  bool local_b1;
  IsoWriter *local_a8;
  FileEntryInfo *fileEntry;
  undefined1 local_98 [8];
  string fileName;
  IsoWriter *local_68;
  FileEntryInfo *nextEntry;
  size_t i;
  size_t idxMax;
  bool isDir;
  IsoWriter *pIStack_48;
  FileEntryInfo *entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  FileTypes fileType_local;
  string *name_local;
  IsoWriter *this_local;
  
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = fileType;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  splitStr_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&entry,pcVar2,'/');
  pIStack_48 = (IsoWriter *)this->m_rootDirInfo;
  if (pIStack_48 == (IsoWriter *)0x0) {
    this_local = (IsoWriter *)0x0;
    goto LAB_002af57b;
  }
  local_b1 = parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == Directory ||
             parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == SystemStreamDirectory;
  if (parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == Directory ||
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == SystemStreamDirectory) {
    local_c0 = (FileEntryInfo *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&entry);
  }
  else {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&entry);
    local_c0 = (FileEntryInfo *)(sVar3 - 1);
  }
  for (nextEntry = (FileEntryInfo *)0x0; nextEntry < local_c0;
      nextEntry = (FileEntryInfo *)
                  ((long)&(nextEntry->m_subDirs).
                          super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1)) {
    name_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&entry,(size_type)nextEntry);
    local_68 = (IsoWriter *)FileEntryInfo::subDirByName((FileEntryInfo *)pIStack_48,name_00);
    if (local_68 == (IsoWriter *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&entry,(size_type)nextEntry);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = mkdir(this,pcVar2,(__mode_t)pIStack_48);
      local_68 = (IsoWriter *)CONCAT44(extraout_var,iVar1);
    }
    pIStack_48 = local_68;
  }
  if (local_b1) {
    this_local = (IsoWriter *)0x0;
    goto LAB_002af57b;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::rbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&fileEntry);
  pbVar4 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&fileEntry);
  std::__cxx11::string::string((string *)local_98,(string *)pbVar4);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    local_a8 = (IsoWriter *)
               FileEntryInfo::fileByName((FileEntryInfo *)pIStack_48,(string *)local_98);
    if (local_a8 == (IsoWriter *)0x0) {
      local_a8 = (IsoWriter *)
                 createFileEntry(this,(FileEntryInfo *)pIStack_48,
                                 parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (local_a8 == (IsoWriter *)0x0) {
        this_local = (IsoWriter *)0x0;
        goto LAB_002af56f;
      }
      FileEntryInfo::setName((FileEntryInfo *)local_a8,(string *)local_98);
    }
    this_local = local_a8;
  }
  else {
    this_local = pIStack_48;
  }
LAB_002af56f:
  std::__cxx11::string::~string((string *)local_98);
LAB_002af57b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&entry);
  return (FileEntryInfo *)this_local;
}

Assistant:

FileEntryInfo *IsoWriter::getEntryByName(const std::string &name, const FileTypes fileType)
{
    const std::vector<std::string> parts = splitStr(name.c_str(), '/');
    FileEntryInfo *entry = m_rootDirInfo;
    if (!entry)
        return nullptr;
    const bool isDir = fileType == FileTypes::Directory || fileType == FileTypes::SystemStreamDirectory;
    const size_t idxMax = isDir ? parts.size() : parts.size() - 1;
    for (size_t i = 0; i < idxMax; ++i)
    {
        FileEntryInfo *nextEntry = entry->subDirByName(parts[i]);
        if (!nextEntry)
            nextEntry = mkdir(parts[i].c_str(), entry);
        entry = nextEntry;
    }
    if (isDir)
        return nullptr;

    const std::string fileName = *parts.rbegin();
    if (fileName.empty())
        return entry;
    FileEntryInfo *fileEntry = entry->fileByName(fileName);
    if (!fileEntry)
    {
        fileEntry = createFileEntry(entry, fileType);
        if (!fileEntry)
            return nullptr;
        fileEntry->setName(fileName);
    }

    return fileEntry;
}